

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_fetch_value(fy_parser *fyp,int c)

{
  fy_token_list *fytl;
  uint uVar1;
  list_head *plVar2;
  undefined4 flags;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  fy_atom *pfVar6;
  fy_token *pfVar7;
  fy_atom *pfVar8;
  uint *puVar9;
  fy_atom *pfVar10;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  int iVar14;
  fy_input *pfVar15;
  ulong uVar16;
  fy_simple_key *_n;
  ushort uVar17;
  list_head *plVar18;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  char *pcStack_108;
  fy_input *pfStack_100;
  char *pcStack_f8;
  fy_input *pfStack_f0;
  char *pcStack_e8;
  code *pcStack_e0;
  undefined1 local_d8 [16];
  list_head *local_c8;
  char *pcStack_c0;
  size_t local_b8;
  ulong local_a0;
  ulong local_98;
  undefined1 local_90 [8];
  fy_token_list sk_tl;
  ulong local_58;
  fy_input *local_50;
  fy_token *local_48;
  _Bool local_3d;
  uint local_3c;
  char cStack_38;
  _Bool did_purge;
  byte local_31;
  
  puVar9 = (uint *)local_d8;
  if (c == 0x3a) {
    if (fyp == (fy_parser *)0x0) {
      plVar18 = (list_head *)0x0;
      uVar16 = 0;
      pfVar15 = (fy_input *)0x0;
LAB_0012c7fc:
      local_90 = (undefined1  [8])local_90;
      sk_tl._lh.next = (list_head *)local_90;
      if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
        pcStack_e0 = (code *)0x12c82a;
        iVar5 = fy_purge_stale_simple_keys(fyp,&local_3d,FYTT_VALUE);
        if (iVar5 != 0) {
          pcVar12 = "fy_purge_stale_simple_keys() failed";
          _n = (fy_simple_key *)0x0;
          pcStack_e0 = (code *)0x4;
          uVar11 = 4;
          iVar5 = 0x7e3;
          puVar9 = (uint *)local_d8;
          goto LAB_0012c855;
        }
        _n = (fy_simple_key *)(fyp->simple_keys)._lh.next;
        pcStack_e8 = (char *)(ulong)(uint)fyp->flow_level;
        if ((_n == (fy_simple_key *)0x0 || _n == (fy_simple_key *)&fyp->simple_keys) ||
           (_n->flow_level != fyp->flow_level)) {
          pfStack_f0 = (fy_input *)0x12c99e;
          sk_tl._lh.prev = plVar18;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7ed,"fy_fetch_value","no simple key flow_level=%d");
          _cStack_38 = (undefined4)CONCAT71((int7)((ulong)pcStack_e8 >> 8),1);
          if ((fyp->queued_tokens)._lh.next == &(fyp->queued_tokens)._lh) {
            local_48 = (fy_token *)0x0;
          }
          else {
            local_48 = (fy_token *)(fyp->queued_tokens)._lh.prev;
          }
          _n = (fy_simple_key *)0x0;
          local_58 = uVar16;
          local_50 = pfVar15;
        }
        else {
          plVar18 = (_n->node).next;
          plVar2 = (_n->node).prev;
          plVar18->prev = plVar2;
          plVar2->next = plVar18;
          (_n->node).next = (list_head *)_n;
          (_n->node).prev = (list_head *)_n;
          if ((_n->field_0x3c & 2) == 0) {
            pcStack_e0 = fy_fetch_anchor_or_alias;
            __assert_fail("fysk->possible",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x7f3,"int fy_fetch_value(struct fy_parser *, int)");
          }
          local_48 = _n->token;
          sk_tl._lh.prev = (list_head *)(_n->mark).input_pos;
          uVar11 = (_n->mark).line;
          pfVar15 = (fy_input *)(ulong)(uint)(_n->mark).column;
          uVar16 = (ulong)(uint)(_n->end_mark).line;
          uVar1 = (_n->end_mark).column;
          _cStack_38 = 0;
          pfStack_f0 = (fy_input *)0x12c963;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7f9,"fy_fetch_value","have simple key flow_level=%d");
          local_58 = (ulong)uVar11;
          local_50 = (fy_input *)(ulong)uVar1;
        }
        pcStack_f8 = (char *)(ulong)(uint)fyp->flow_level;
        pcStack_e8 = (char *)(ulong)(uint)fyp->indent;
        bVar13 = false;
        pfStack_100 = (fy_input *)0x12caa4;
        pfStack_f0 = pfVar15;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x7fd,"fy_fetch_value","flow_level=%d, column=%d parse_indent=%d");
        iVar5 = fyp->pending_complex_key_column;
        if ((-1 < iVar5) && (bVar13 = true, fyp->flow_level == 0)) {
          bVar13 = fyp->column <= (fyp->pending_complex_key_mark).column;
        }
        uVar17 = *(ushort *)&fyp->field_0x70;
        local_31 = 1;
        iVar14 = (int)pfVar15;
        if (fyp->flow_level == 0) {
          bVar4 = (byte)((uVar17 & 0x20) >> 5);
          local_3c = (uint)CONCAT11((char)(uVar17 >> 8),fyp->indent < iVar14);
        }
        else {
          local_3c = 0;
          bVar4 = 1;
        }
        uVar11 = fyp->line;
        if ((iVar5 < 0 & bVar4) == 0) {
          local_31 = (bVar13 ^ 1U) & -1 < iVar5;
        }
        pfStack_f0 = local_50;
        pcStack_108 = (char *)local_58;
        uStack_110._0_4_ = 0x12cb69;
        uStack_110._4_4_ = 0;
        pfStack_100 = pfVar15;
        pcStack_f8 = (char *)uVar16;
        pcStack_e8 = (char *)(ulong)uVar11;
        local_98 = uVar16;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x80a,"fy_fetch_value",
                       "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d");
        pcStack_e8 = "true";
        local_118 = (undefined1  [8])0x142c4f;
        if ((*(ushort *)&fyp->field_0x70 & 8) == 0) {
          local_118 = (undefined1  [8])0x14430f;
        }
        uStack_110 = "false";
        if (-1 < iVar5) {
          uStack_110 = "true";
        }
        pcStack_108 = "true";
        if (bVar13 == false) {
          pcStack_108 = "false";
        }
        pfStack_100 = (fy_input *)0x142c4f;
        if ((int)uVar11 <= (int)uVar16) {
          pfStack_100 = (fy_input *)0x14430f;
        }
        pcStack_f8 = "true";
        if ((uVar17 & 0x20) == 0) {
          pcStack_f8 = "false";
        }
        pfStack_f0 = (fy_input *)0x142c4f;
        if ((char)local_3c == '\0') {
          pfStack_f0 = (fy_input *)0x14430f;
        }
        if (local_31 == 0) {
          pcStack_e8 = "false";
        }
        pfVar8 = (fy_atom *)local_118;
        local_a0 = (ulong)uVar11;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x814,"fy_fetch_value",
                       "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s"
                      );
        pfVar10 = (fy_atom *)local_d8;
        puVar9 = (uint *)local_d8;
        pfVar6 = (fy_atom *)local_d8;
        if (((iVar5 < 0) && ((int)local_98 < (int)local_a0)) &&
           ((fyp->flow_level == 0 || (fyp->flow != FYFT_MAP)))) {
          local_b8 = 0;
          local_c8 = (list_head *)0x0;
          pcStack_c0 = (char *)0x0;
          local_d8._0_8_ = (list_head *)0x200000004;
          pfVar6 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
          local_d8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar6);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)local_d8,"Illegal placement of \':\' indicator");
          iVar14 = -1;
          goto LAB_0012ca32;
        }
        if ((char)local_3c == '\0') {
          if (local_31 != 0) {
LAB_0012cda9:
            pfVar6 = (fy_atom *)local_118;
            pfVar8 = fy_fill_atom(fyp,0,pfVar6);
            pfVar7 = fy_token_queue_internal(fyp,(fy_token_list *)local_90,FYTT_KEY,pfVar8);
            pfVar10 = pfVar6;
            if (pfVar7 == (fy_token *)0x0) {
              pcVar12 = "fy_token_queue_internal() failed";
              uVar11 = 4;
              iVar5 = 0x835;
              goto LAB_0012d03a;
            }
          }
          *(undefined8 *)&pfVar10[-1].increment = 0x12cdf0;
          fyp_debug_dump_token(fyp,local_48,"insert-token: ");
          fytl = &fyp->queued_tokens;
          *(undefined8 *)&pfVar10[-1].increment = 0x12ce0c;
          fyp_debug_dump_token_list(fyp,fytl,local_48,"fyp->queued_tokens (before): ");
          *(undefined8 *)&pfVar10[-1].increment = 0x12ce27;
          fyp_debug_dump_token_list(fyp,(fy_token_list *)local_90,(fy_token *)0x0,"sk_tl: ");
          plVar18 = sk_tl._lh.next;
          pfVar7 = (fy_token *)fytl;
          if ((local_48 == (fy_token *)0x0) || (pfVar7 = local_48, cStack_38 != '\0')) {
            if (local_90 != (undefined1  [8])local_90) goto LAB_0012ce4d;
          }
          else if (local_90 != (undefined1  [8])local_90) {
            pfVar7 = (fy_token *)(local_48->node).prev;
LAB_0012ce4d:
            plVar2 = (pfVar7->node).next;
            *(fy_token **)((long)local_90 + 8) = pfVar7;
            (pfVar7->node).next = (list_head *)local_90;
            plVar18->next = plVar2;
            plVar2->prev = plVar18;
          }
          *(undefined8 *)&pfVar10[-1].increment = 0x12ce77;
          fyp_debug_dump_token_list(fyp,fytl,local_48,"fyp->queued_tokens (after): ");
          if (cStack_38 == '\0') {
            uVar17 = 0;
          }
          else {
            uVar17 = (ushort)(fyp->flow_level == 0) << 3;
          }
          pfVar6 = (fy_atom *)&pfVar10[-2].increment;
          pfVar10[-2].fyi = (fy_input *)0x1;
          uVar3 = pfVar10[-2].fyi;
          pfVar10[-2].fyi = (fy_input *)0x12cea4;
          pfVar8 = fy_fill_atom(fyp,(int)uVar3,pfVar6);
          pfVar10[-2].fyi = (fy_input *)0x11;
          uVar3 = pfVar10[-2].fyi;
          pfVar10[-2].fyi = (fy_input *)0x12ceb7;
          pfVar7 = fy_token_queue(fyp,(fy_token_type)uVar3,pfVar8);
          if (pfVar7 != (fy_token *)0x0) {
            *(ushort *)&fyp->field_0x70 = (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 | uVar17;
            pcVar12 = "true";
            if (uVar17 == 0) {
              pcVar12 = "false";
            }
            pfVar10[-2].storage_hint = 0x20;
            uVar3 = pfVar10[-2].storage_hint;
            pfVar10[-2].storage_hint = (size_t)pcVar12;
            pfVar10[-2].end_mark.line = 0x12cf12;
            pfVar10[-2].end_mark.column = 0;
            fy_parser_diag(fyp,(uint)uVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x84f,"fy_fetch_value","simple_key_allowed -> %s\n");
            if (cStack_38 == '\0') {
              pfVar10[-2].fyi = (fy_input *)0x12cf25;
              fy_parse_simple_key_recycle(fyp,_n);
            }
            if (bVar13 != false) {
              fyp->pending_complex_key_column = -1;
              *(undefined4 *)&pfVar10[-2].storage_hint = 0xffffffff;
              pfVar10[-2].end_mark.line = 0x20;
              pfVar10[-2].end_mark.column = 0;
              flags = pfVar10[-2].end_mark.line;
              pfVar10[-2].end_mark.line = 0x12cf5e;
              pfVar10[-2].end_mark.column = 0;
              fy_parser_diag(fyp,flags,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x857,"fy_fetch_value","pending_complex_key_column -> %d");
            }
            puVar9 = &pfVar10[-2].increment;
            if (local_48 == (fy_token *)0x0) {
              return 0;
            }
            while( true ) {
              pfVar10[-2].fyi = (fy_input *)0x12cf7f;
              iVar5 = fy_parse_peek(fyp);
              if ((iVar5 != 9) && (iVar5 != 0x20)) break;
              pfVar10[-2].fyi = (fy_input *)0x12cf77;
              fy_advance(fyp,iVar5);
            }
            if (iVar5 != 0x23) {
              return 0;
            }
            pfVar10[-2].fyi = (fy_input *)0x12cfa9;
            iVar5 = fy_scan_comment(fyp,local_48->comment + 1,false);
            if (iVar5 == 0) {
              return 0;
            }
            pcVar12 = "fy_scan_comment() failed";
            pfVar10[-2].fyi = (fy_input *)0x4;
            uVar11 = (uint)pfVar10[-2].fyi;
            iVar5 = 0x863;
            goto LAB_0012c855;
          }
          pcVar12 = "fy_token_queue() failed";
          pfVar10[-2].fyi = (fy_input *)0x4;
          uVar11 = (uint)pfVar10[-2].fyi;
          iVar5 = 0x84c;
        }
        else {
          if (fyp->flow_level != 0) {
            pcStack_e0 = (code *)0x12d065;
            __assert_fail("!fyp->flow_level",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x81d,"int fy_fetch_value(struct fy_parser *, int)");
          }
          pcStack_e0 = (code *)0x12cc80;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x81f,"fy_fetch_value","--- parse_roll");
          pcStack_e0 = (code *)0x12cc92;
          iVar5 = fy_push_indent(fyp,iVar14,true);
          if (iVar5 != 0) {
            pcVar12 = "fy_push_indent() failed";
            pcStack_e0 = (code *)0x4;
            uVar11 = 4;
            iVar5 = 0x824;
            goto LAB_0012c855;
          }
          pcStack_e0 = (code *)0x12cd50;
          fy_fill_atom_start(fyp,(fy_atom *)local_d8);
          pcStack_e0 = (code *)0x12cd5b;
          fy_fill_atom_end(fyp,(fy_atom *)local_d8);
          local_c8 = sk_tl._lh.prev;
          pcStack_c0 = (char *)CONCAT44(iVar14,(int)local_58);
          local_d8._0_8_ = sk_tl._lh.prev;
          local_d8._8_8_ = CONCAT44(iVar14,(int)local_58);
          pcStack_e0 = (code *)0x12cda0;
          pfVar7 = fy_token_queue_internal
                             (fyp,(fy_token_list *)local_90,FYTT_BLOCK_MAPPING_START,
                              (fy_atom *)local_d8);
          if (pfVar7 != (fy_token *)0x0) goto LAB_0012cda9;
          pcVar12 = "fy_token_queue_internal() failed";
          pcStack_e0 = (code *)0x4;
          uVar11 = 4;
          iVar5 = 0x82e;
        }
LAB_0012d03a:
        iVar14 = 0;
        *(undefined8 *)&pfVar6[-1].increment = 0x12d041;
        fy_parser_diag(fyp,uVar11,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,iVar5,"fy_fetch_value",pcVar12);
        pfVar8 = pfVar6;
        goto LAB_0012ca32;
      }
      local_b8 = 0;
      local_c8 = (list_head *)0x0;
      pcStack_c0 = (char *)0x0;
      local_d8._0_8_ = (list_head *)0x200000004;
      pfVar6 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
      local_d8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar6);
      pcVar12 = "wrongly indented mapping value in flow mode";
    }
    else {
      if (((fyp->current_input == (fy_input *)0x0) || ((fyp->current_input->field_0x74 & 1) == 0))
         || (fyp->flow == FYFT_MAP)) {
        plVar18 = (list_head *)fyp->current_input_pos;
        uVar16 = (ulong)(uint)fyp->line;
        pfVar15 = (fy_input *)(ulong)(uint)fyp->column;
        goto LAB_0012c7fc;
      }
      local_b8 = 0;
      local_c8 = (list_head *)0x0;
      pcStack_c0 = (char *)0x0;
      local_d8._0_8_ = (list_head *)0x200000004;
      pfVar6 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
      local_d8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar6);
      pcVar12 = "JSON considers keys when not in mapping context invalid";
    }
    puVar9 = (uint *)local_118;
    _n = (fy_simple_key *)0x0;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_d8,pcVar12);
  }
  else {
    pcVar12 = "illegal value mark";
    _n = (fy_simple_key *)0x0;
    pcStack_e0 = (code *)0x4;
    uVar11 = 4;
    iVar5 = 0x7d3;
LAB_0012c855:
    *(undefined8 *)((long)puVar9 + -8) = 0x12c85c;
    fy_parser_diag(fyp,uVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar5,"fy_fetch_value",pcVar12);
  }
  *(undefined8 *)((long)puVar9 + -8) = 0xffffffffffffffff;
  iVar14 = (int)*(undefined8 *)((long)puVar9 + -8);
  pfVar8 = (fy_atom *)puVar9;
LAB_0012ca32:
  *(undefined8 *)((long)pfVar8 + -8) = 0x12ca3d;
  fy_parse_simple_key_recycle(fyp,_n);
  return iVar14;
}

Assistant:

int fy_fetch_value(struct fy_parser *fyp, int c) {
    struct fy_token_list sk_tl;
    struct fy_simple_key *fysk = NULL;
    struct fy_mark mark, mark_insert, mark_end_insert;
    struct fy_token *fyt_insert, *fyt;
    struct fy_atom handle;
    bool target_simple_key_allowed, is_complex, has_bmap;
    bool push_bmap_start, push_key_only, did_purge, final_complex_key;
    bool is_multiline __FY_DEBUG_UNUSED__;
    int rc;

    fyp_error_check(fyp, c == ':', err_out,
                    "illegal value mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_json_mode(fyp) || fyp->flow == FYFT_MAP, err_out,
                          "JSON considers keys when not in mapping context invalid");

    fy_get_mark(fyp, &mark);

    fy_token_list_init(&sk_tl);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping value in flow mode");

    rc = fy_purge_stale_simple_keys(fyp, &did_purge, FYTT_VALUE);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_purge_stale_simple_keys() failed");

    /* get the simple key (if available) for the value */
    fysk = fy_simple_key_list_head(&fyp->simple_keys);
    if (fysk && fysk->flow_level == fyp->flow_level)
        fy_simple_key_list_del(&fyp->simple_keys, fysk);
    else
        fysk = NULL;

    if (!fysk) {
        fyp_scan_debug(fyp, "no simple key flow_level=%d", fyp->flow_level);

        fyt_insert = fy_token_list_tail(&fyp->queued_tokens);
        mark_insert = mark;
        mark_end_insert = mark;
    } else {
        assert(fysk->possible);
        assert(fysk->flow_level == fyp->flow_level);
        fyt_insert = fysk->token;
        mark_insert = fysk->mark;
        mark_end_insert = fysk->end_mark;

        fyp_scan_debug(fyp, "have simple key flow_level=%d", fyp->flow_level);
    }

    fyp_scan_debug(fyp, "flow_level=%d, column=%d parse_indent=%d",
                   fyp->flow_level, mark_insert.column, fyp->indent);

    is_complex = fyp->pending_complex_key_column >= 0;
    final_complex_key = is_complex && (fyp->flow_level || fyp->column <= fyp->pending_complex_key_mark.column);
    is_multiline = mark_end_insert.line < fyp->line;
    has_bmap = fyp->generated_block_map;
    push_bmap_start = (!fyp->flow_level && mark_insert.column > fyp->indent);
    push_key_only = (!is_complex && (fyp->flow_level || has_bmap)) ||
                    (is_complex && !final_complex_key);

    fyp_scan_debug(fyp, "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d",
                   mark_insert.line, mark_insert.column,
                   mark_end_insert.line, mark_end_insert.column,
                   fyp->line);

    fyp_scan_debug(fyp,
                   "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s",
                   fyp->simple_key_allowed ? "true" : "false",
                   is_complex ? "true" : "false",
                   final_complex_key ? "true" : "false",
                   is_multiline ? "true" : "false",
                   has_bmap ? "true" : "false",
                   push_bmap_start ? "true" : "false",
                   push_key_only ? "true" : "false");

    if (!is_complex && is_multiline && (!fyp->flow_level || fyp->flow != FYFT_MAP)) {
        FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN, "Illegal placement of ':' indicator");
        goto err_out;
    }

    if (push_bmap_start) {

        assert(!fyp->flow_level);

        fyp_scan_debug(fyp, "--- parse_roll");

        /* push the new indent level */
        rc = fy_push_indent(fyp, mark_insert.column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fy_fill_atom_start(fyp, &handle);
        fy_fill_atom_end(fyp, &handle);

        handle.start_mark = handle.end_mark = mark_insert;

        /* and the block mapping start */
        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_BLOCK_MAPPING_START, &handle);
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (push_bmap_start || push_key_only) {

        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_KEY, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");

    }

    fyp_debug_dump_token(fyp, fyt_insert, "insert-token: ");
    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (before): ");
    fyp_debug_dump_token_list(fyp, &sk_tl, NULL, "sk_tl: ");

    if (fyt_insert) {

        if (fysk)
            fy_token_list_splice_before(&fyp->queued_tokens, fyt_insert, &sk_tl);
        else
            fy_token_list_splice_after(&fyp->queued_tokens, fyt_insert, &sk_tl);
    } else
        fy_token_lists_splice(&fyp->queued_tokens, &sk_tl);

    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (after): ");

    target_simple_key_allowed = fysk ? false : !fyp->flow_level;

    fyt = fy_token_queue(fyp, FYTT_VALUE, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    if (fysk)
        fy_parse_simple_key_recycle(fyp, fysk);

    if (final_complex_key) {
        fyp->pending_complex_key_column = -1;
        fyp_scan_debug(fyp, "pending_complex_key_column -> %d",
                       fyp->pending_complex_key_column);
    }

    if (fyt_insert) {
        /* eat whitespace */
        while (fy_is_blank(c = fy_parse_peek(fyp)))
            fy_advance(fyp, c);

        /* comment? */
        if (c == '#') {
            rc = fy_scan_comment(fyp, &fyt_insert->comment[fycp_right], false);
            fyp_error_check(fyp, !rc, err_out_rc,
                            "fy_scan_comment() failed");
        }
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fy_parse_simple_key_recycle(fyp, fysk);
    return rc;
}